

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

StatusOr<long>
google::protobuf::json_internal::anon_unknown_5::
ParseInt<google::protobuf::json_internal::ParseProto3Type>
          (JsonLexer *lex,Field<google::protobuf::json_internal::ParseProto3Type> field)

{
  uint uVar1;
  long in_RDX;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 extraout_RDX;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  StatusOr<long> SVar2;
  Status _status;
  StatusOr<google::protobuf::json_internal::LocationWith<long>_> n;
  
  ParseIntInner<long>(&n,(JsonLexer *)field,in_XMM0_Qa,in_XMM1_Qa);
  absl::lts_20240722::Status::Status(&_status,(Status *)&n);
  if (_status.rep_ == 1) {
    absl::lts_20240722::Status::~Status(&_status);
    uVar1 = *(uint *)(*(long *)(in_RDX + 8) + 0x48);
    if ((0x11 < uVar1) || ((0x2a0a4U >> (uVar1 & 0x1f) & 1) == 0)) {
LAB_00296321:
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<long>_>::EnsureOk
                (&n.super_StatusOrData<google::protobuf::json_internal::LocationWith<long>_>);
      (lex->stream_).last_chunk_._M_len =
           n.super_StatusOrData<google::protobuf::json_internal::LocationWith<long>_>.field_1.data_.
           value;
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
      goto LAB_0029633b;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<long>_>::EnsureOk
              (&n.super_StatusOrData<google::protobuf::json_internal::LocationWith<long>_>);
    if (-0x80000001 <
        n.super_StatusOrData<google::protobuf::json_internal::LocationWith<long>_>.field_1.data_.
        value) {
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<long>_>::EnsureOk
                (&n.super_StatusOrData<google::protobuf::json_internal::LocationWith<long>_>);
      if (n.super_StatusOrData<google::protobuf::json_internal::LocationWith<long>_>.field_1.data_.
          value < 0x80000000) goto LAB_00296321;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<long>_>::EnsureOk
              (&n.super_StatusOrData<google::protobuf::json_internal::LocationWith<long>_>);
    JsonLocation::Invalid
              ((JsonLocation *)&_status,
               (undefined1 *)
               ((long)&n.super_StatusOrData<google::protobuf::json_internal::LocationWith<long>_>.
                       field_1 + 8),0x14,"integer out of range");
    absl::lts_20240722::internal_statusor::StatusOrData<long>::
    StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<long> *)lex,&_status);
  }
  else {
    absl::lts_20240722::internal_statusor::StatusOrData<long>::
    StatusOrData<const_absl::lts_20240722::Status,_0>((StatusOrData<long> *)lex,&_status);
  }
  absl::lts_20240722::Status::~Status(&_status);
LAB_0029633b:
  absl::lts_20240722::Status::~Status((Status *)&n);
  SVar2.super_StatusOrData<long>.field_1.data_ = extraout_RDX.data_;
  SVar2.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)lex;
  return (StatusOr<long>)SVar2.super_StatusOrData<long>;
}

Assistant:

absl::StatusOr<int64_t> ParseInt(JsonLexer& lex, Field<Traits> field) {
  absl::StatusOr<LocationWith<int64_t>> n =
      ParseIntInner<int64_t>(lex, -9007199254740992.0, 9007199254740992.0);
  RETURN_IF_ERROR(n.status());

  if (Traits::Is32Bit(field)) {
    if (std::numeric_limits<int32_t>::min() > n->value ||
        n->value > std::numeric_limits<int32_t>::max()) {
      return n->loc.Invalid("integer out of range");
    }
  }

  return n->value;
}